

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall nonius::standard_reporter::do_estimate_clock_cost_start(standard_reporter *this)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  
  if (this->verbose == true) {
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (&(this->super_reporter).os);
    std::operator<<(pbVar1,"estimating cost of a clock call\n");
    return;
  }
  return;
}

Assistant:

void do_estimate_clock_cost_start() override {
            if(verbose) report_stream() << "estimating cost of a clock call\n";
        }